

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O0

int __thiscall
ut11::detail::DeclareFixtureObj<WillPassTests>::operator()<>
          (DeclareFixtureObj<WillPassTests> *this,Category *category)

{
  WillPassTests *this_00;
  pointer pWVar1;
  shared_ptr<ut11::detail::TestFixtureAbstract> local_c0;
  Category local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  unique_ptr<WillPassTests,_std::default_delete<WillPassTests>_> local_20;
  unique_ptr<WillPassTests,_std::default_delete<WillPassTests>_> fixture;
  Category *category_local;
  DeclareFixtureObj<WillPassTests> *this_local;
  
  fixture._M_t.super___uniq_ptr_impl<WillPassTests,_std::default_delete<WillPassTests>_>._M_t.
  super__Tuple_impl<0UL,_WillPassTests_*,_std::default_delete<WillPassTests>_>.
  super__Head_base<0UL,_WillPassTests_*,_false>._M_head_impl =
       (__uniq_ptr_data<WillPassTests,_std::default_delete<WillPassTests>,_true,_true>)
       (__uniq_ptr_data<WillPassTests,_std::default_delete<WillPassTests>,_true,_true>)category;
  this_00 = (WillPassTests *)operator_new(0x70);
  this_00->m_expected = 0;
  this_00->m_actual = 0;
  *(undefined8 *)&this_00->m_result = 0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_categories._M_t._M_impl = 0;
  *(undefined8 *)
   &(this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x20 = 0;
  (this_00->super_TestFixture).m_StageBuilder._M_t.
  super___uniq_ptr_impl<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_ut11::detail::TestStageBuilder_*,_std::default_delete<ut11::detail::TestStageBuilder>_>
  .super__Head_base<0UL,_ut11::detail::TestStageBuilder_*,_false>._M_head_impl =
       (TestStageBuilder *)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x10 = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x18 = 0;
  (this_00->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_name = 0;
  WillPassTests::WillPassTests(this_00);
  std::unique_ptr<WillPassTests,std::default_delete<WillPassTests>>::
  unique_ptr<std::default_delete<WillPassTests>,void>
            ((unique_ptr<WillPassTests,std::default_delete<WillPassTests>> *)&local_20,this_00);
  pWVar1 = std::unique_ptr<WillPassTests,_std::default_delete<WillPassTests>_>::operator->
                     (&local_20);
  std::operator+(local_70,(char *)this);
  GetString_abi_cxx11_();
  std::operator+(local_50,local_70);
  TestFixture::SetName(&pWVar1->super_TestFixture,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_70);
  pWVar1 = std::unique_ptr<WillPassTests,_std::default_delete<WillPassTests>_>::operator->
                     (&local_20);
  Category::Category(&local_b0,category);
  (*(pWVar1->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[2])
            (pWVar1,&local_b0);
  Category::~Category(&local_b0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::
  shared_ptr<WillPassTests,std::default_delete<WillPassTests>,void>(&local_c0,&local_20);
  PushFixture(&local_c0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::~shared_ptr(&local_c0);
  std::unique_ptr<WillPassTests,_std::default_delete<WillPassTests>_>::~unique_ptr(&local_20);
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}